

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O0

int CfdFinalizeMultisigScript
              (void *handle,void *multisig_handle,uint32_t require_num,char **address,
              char **redeem_script,char **witness_script)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 *in_RCX;
  uint32_t in_EDX;
  long in_RSI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  ElementsAddressFactory factory_1;
  AddressFactory factory;
  Script multisig_script;
  bool has_witness;
  Pubkey *in_stack_00000478;
  AddressType in_stack_00000484;
  AddressFactory *in_stack_00000488;
  uint32_t index;
  Script *in_stack_000004a0;
  Script witness_script_obj;
  Script redeem_script_obj;
  Script script;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  AddressType addr_type;
  Address addr;
  NetType net_type;
  bool is_bitcoin;
  CfdCapiMultisigScript *data;
  char *work_witness_script;
  char *work_redeem_script;
  char *work_address;
  undefined8 in_stack_fffffffffffff808;
  NetType type;
  Address *in_stack_fffffffffffff810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff818;
  string *in_stack_fffffffffffff820;
  undefined8 in_stack_fffffffffffff828;
  CfdError error_code;
  undefined7 in_stack_fffffffffffff830;
  undefined1 in_stack_fffffffffffff837;
  undefined8 in_stack_fffffffffffff848;
  NetType type_00;
  ElementsAddressFactory *in_stack_fffffffffffff850;
  bool *in_stack_fffffffffffff868;
  string *in_stack_fffffffffffff870;
  allocator *paVar3;
  string local_758;
  string local_738;
  string local_718;
  string *in_stack_fffffffffffff918;
  void *in_stack_fffffffffffff920;
  Address local_558;
  Script local_3b8;
  byte local_37a;
  allocator local_379;
  string local_378 [36];
  uint local_354;
  Script local_350;
  Script local_318;
  Script local_2e0;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_2a8;
  AddressType local_28c;
  Address local_288;
  NetType local_110;
  byte local_10b;
  undefined1 local_10a;
  allocator local_109;
  string local_108 [32];
  CfdSourceLocation local_e8;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  CfdSourceLocation local_a8;
  long local_90;
  allocator local_81;
  string local_80 [48];
  char *local_50;
  char *local_48;
  char *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  uint32_t local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff828 >> 0x20);
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"MultisigScript",&local_81);
  cfd::capi::CheckBuffer(in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_90 = local_18;
  if (*(int *)(local_18 + 0xa54) == 0) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x134;
    local_a8.funcname = "CfdFinalizeMultisigScript";
    cfd::core::logger::warn<>(&local_a8,"pubkey not found.");
    local_ca = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Failed to parameter. pubkey not found.",&local_c9);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               error_code,in_stack_fffffffffffff820);
    local_ca = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(uint *)(local_18 + 0xa54) < 0x15) {
    local_10b = 0;
    local_110 = cfd::capi::ConvertNetType
                          ((int)((ulong)in_stack_fffffffffffff870 >> 0x20),in_stack_fffffffffffff868
                          );
    cfd::core::Address::Address(&local_288);
    local_28c = cfd::capi::ConvertHashToAddressType((int)((ulong)in_stack_fffffffffffff870 >> 0x20))
    ;
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)0x57fcd9);
    cfd::core::Script::Script(&local_2e0);
    cfd::core::Script::Script(&local_318);
    cfd::core::Script::Script(&local_350);
    local_354 = 0;
    while( true ) {
      type_00 = (NetType)((ulong)in_stack_fffffffffffff848 >> 0x20);
      type = (NetType)((ulong)in_stack_fffffffffffff808 >> 0x20);
      if (*(uint *)(local_90 + 0xa54) <= local_354) break;
      in_stack_fffffffffffff850 =
           (ElementsAddressFactory *)(local_90 + 0x18 + (ulong)local_354 * 0x83);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_378,(char *)in_stack_fffffffffffff850,&local_379);
      std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>::
      emplace_back<std::__cxx11::string>
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                 in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      std::__cxx11::string::~string(local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
      local_354 = local_354 + 1;
    }
    local_37a = local_28c != kP2shAddress;
    cfd::core::ScriptUtil::CreateMultisigRedeemScript
              (&local_3b8,local_1c,&local_2a8,(bool)local_37a);
    if ((local_10b & 1) == 0) {
      cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_fffffffffffff850,type_00);
      cfd::AddressFactory::CreateAddress
                (in_stack_00000488,in_stack_00000484,in_stack_00000478,
                 (Script *)
                 multisig_script.script_stack_.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (Script *)
                 multisig_script.script_stack_.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish,in_stack_000004a0);
      cfd::core::Address::operator=(&local_288,(Address *)&stack0xfffffffffffff908);
      cfd::core::Address::~Address(in_stack_fffffffffffff810);
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x58003a);
    }
    else {
      cfd::AddressFactory::AddressFactory((AddressFactory *)in_stack_fffffffffffff810,type);
      cfd::AddressFactory::CreateAddress
                (in_stack_00000488,in_stack_00000484,in_stack_00000478,
                 (Script *)
                 multisig_script.script_stack_.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (Script *)
                 multisig_script.script_stack_.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish,in_stack_000004a0);
      cfd::core::Address::operator=(&local_288,&local_558);
      cfd::core::Address::~Address(in_stack_fffffffffffff810);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x57ff37);
    }
    if ((local_37a & 1) == 0) {
      cfd::core::Script::operator=(&local_318,&local_3b8);
    }
    else {
      cfd::core::Script::operator=(&local_350,&local_3b8);
    }
    cfd::core::Address::GetAddress_abi_cxx11_(&local_718,&local_288);
    local_40 = cfd::capi::CreateString(in_stack_fffffffffffff870);
    std::__cxx11::string::~string((string *)&local_718);
    if ((local_30 != (undefined8 *)0x0) && (bVar1 = cfd::core::Script::IsEmpty(&local_318), !bVar1))
    {
      cfd::core::Script::GetHex_abi_cxx11_(&local_738,&local_318);
      local_48 = cfd::capi::CreateString(in_stack_fffffffffffff870);
      std::__cxx11::string::~string((string *)&local_738);
    }
    if ((local_38 != (undefined8 *)0x0) && (bVar1 = cfd::core::Script::IsEmpty(&local_350), !bVar1))
    {
      cfd::core::Script::GetHex_abi_cxx11_(&local_758,&local_350);
      local_50 = cfd::capi::CreateString(in_stack_fffffffffffff870);
      std::__cxx11::string::~string((string *)&local_758);
    }
    *local_28 = local_40;
    if (local_48 != (char *)0x0) {
      *local_30 = local_48;
    }
    if (local_50 != (char *)0x0) {
      *local_38 = local_50;
    }
    local_4 = 0;
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff810);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff810);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff810);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff810);
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
               in_stack_fffffffffffff820);
    cfd::core::Address::~Address(in_stack_fffffffffffff810);
    return local_4;
  }
  local_e8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
               ,0x2f);
  local_e8.filename = local_e8.filename + 1;
  local_e8.line = 0x13b;
  local_e8.funcname = "CfdFinalizeMultisigScript";
  cfd::core::logger::warn<>(&local_e8,"The number of pubkey has reached the upper limit.");
  local_10a = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  paVar3 = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"The number of pubkey has reached the upper limit.",paVar3)
  ;
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
             error_code,in_stack_fffffffffffff820);
  local_10a = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdFinalizeMultisigScript(
    void* handle, void* multisig_handle, uint32_t require_num, char** address,
    char** redeem_script, char** witness_script) {
  char* work_address = nullptr;
  char* work_redeem_script = nullptr;
  char* work_witness_script = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(multisig_handle, kPrefixMultisigScript);

    CfdCapiMultisigScript* data =
        static_cast<CfdCapiMultisigScript*>(multisig_handle);
    if (data->current_index == 0) {
      warn(CFD_LOG_SOURCE, "pubkey not found.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to parameter. pubkey not found.");
    }
    if (data->current_index > kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE, "The number of pubkey has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of pubkey has reached the upper limit.");
    }

    bool is_bitcoin = false;
    NetType net_type =
        cfd::capi::ConvertNetType(data->network_type, &is_bitcoin);
    Address addr;
    AddressType addr_type = ConvertHashToAddressType(data->hash_type);
    std::vector<Pubkey> pubkeys;
    Script script;
    Script redeem_script_obj;
    Script witness_script_obj;

    for (uint32_t index = 0; index < data->current_index; ++index) {
      pubkeys.emplace_back(std::string(data->pubkeys[index]));
    }
    bool has_witness = (addr_type != AddressType::kP2shAddress);
    Script multisig_script = ScriptUtil::CreateMultisigRedeemScript(
        require_num, pubkeys, has_witness);

    if (is_bitcoin) {
      AddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, nullptr, &multisig_script, nullptr, &redeem_script_obj);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, nullptr, &multisig_script, nullptr, &redeem_script_obj);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (!has_witness) {
      redeem_script_obj = multisig_script;
    } else {
      witness_script_obj = multisig_script;
    }

    work_address = CreateString(addr.GetAddress());
    if (redeem_script != nullptr) {
      if (!redeem_script_obj.IsEmpty()) {
        work_redeem_script = CreateString(redeem_script_obj.GetHex());
      }
    }
    if (witness_script != nullptr) {
      if (!witness_script_obj.IsEmpty()) {
        work_witness_script = CreateString(witness_script_obj.GetHex());
      }
    }

    *address = work_address;
    if (work_redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (work_witness_script != nullptr) *witness_script = work_witness_script;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_address, &work_redeem_script, &work_witness_script);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_address, &work_redeem_script, &work_witness_script);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_address, &work_redeem_script, &work_witness_script);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}